

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdGetDefaultBlindingKey_Test::TestBody
          (cfdcapi_elements_transaction_CfdGetDefaultBlindingKey_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  char **in_stack_00000020;
  char *in_stack_00000028;
  char *in_stack_00000030;
  void *in_stack_00000038;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *blinding_key;
  char *locking_script;
  char *master_blinding_key;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffde8;
  AssertionResult *in_stack_fffffffffffffdf0;
  CfdErrorCode *in_stack_fffffffffffffdf8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  void **in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe88;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  char *local_100;
  AssertHelper local_f8;
  Message local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe08);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3680fa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x740,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x36815d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3681b2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(type *)0x3681e6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x741,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3682e2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36835d);
  if (local_14 == 0) {
    local_a0 = "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80";
    local_a8 = "001478bf37fbe762374026b2b884f7eb47fa61e3420d";
    local_b0 = (char *)0x0;
    local_14 = CfdGetDefaultBlindingKey
                         (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
    local_c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368462);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x74c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message((Message *)0x3684bf);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368514);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_e8,
                 "\"95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742\"",
                 "blinding_key","95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
                 local_b0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
      if (!bVar2) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3685b7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x750,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message((Message *)0x368614);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x368669);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    }
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe28);
  if (local_14 != 0) {
    local_100 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffe88),(char **)pAVar4);
    local_114 = 0;
    pAVar4 = &local_110;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe08,
               (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368765);
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x759,pcVar3);
      testing::internal::AssertHelper::operator=(&local_128,&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      testing::Message::~Message((Message *)0x3687c2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x368817);
    testing::internal::CmpHelperSTREQ((internal *)&local_138,"\"\"","str_buffer","",local_100);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar2) {
      testing::Message::Message(&local_140);
      in_stack_fffffffffffffe08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3688ac);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x75a,(char *)in_stack_fffffffffffffe08);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x368909);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36895e);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffdf8);
    local_100 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffdf8);
  local_15c = 0;
  pAVar4 = &local_158;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffdf0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x368a2e);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x760,pcVar3);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message((Message *)0x368a8b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x368ae0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdGetDefaultBlindingKey) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    const char* master_blinding_key =
        "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80";
    // ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh
    const char* locking_script = "001478bf37fbe762374026b2b884f7eb47fa61e3420d";

    char* blinding_key = nullptr;
    ret = CfdGetDefaultBlindingKey(
        handle, master_blinding_key, locking_script, &blinding_key);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
          blinding_key);
      CfdFreeStringBuffer(blinding_key);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}